

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCompileDefinitionsCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddCompileDefinitionsCommand::Clone(cmAddCompileDefinitionsCommand *this)

{
  cmCommand *this_00;
  cmAddCompileDefinitionsCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddCompileDefinitionsCommand((cmAddCompileDefinitionsCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddCompileDefinitionsCommand; }